

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grade.h
# Opt level: O3

void __thiscall
Grade::Grade(Grade *this,string *path_to_dir,string *path_to_rawdata,
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>_>
            *preps_map)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  DIR *__dirp;
  dirent *pdVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  ostream *poVar11;
  mapped_type *this_00;
  long lVar12;
  char *__haystack;
  pointer pbVar13;
  long lVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_names;
  string str;
  DataFrame df;
  string dep_number;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
  *local_288;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_280;
  Group local_278;
  string local_1f8;
  string local_1d8;
  vector<Day,_std::allocator<Day>_> local_1b8;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  _Prime_rehash_policy *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  DataFrame local_130;
  long *local_c0 [2];
  long local_b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_288 = &this->group_map;
  p_Var1 = &(this->group_map)._M_t._M_impl.super__Rb_tree_header;
  (this->group_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->group_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->group_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->group_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->group_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_280 = &preps_map->_M_h;
  std::operator+(&local_a0,path_to_dir,path_to_rawdata);
  __dirp = opendir(local_a0._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    perror("");
  }
  else {
    paVar2 = &local_278.groupNumber.field_2;
    paVar3 = &local_130.fileName.field_2;
    while( true ) {
      pdVar7 = readdir(__dirp);
      if (pdVar7 == (dirent *)0x0) break;
      __haystack = pdVar7->d_name;
      pcVar8 = strstr(__haystack,".csv");
      if (pcVar8 != (char *)0x0) {
        local_278.groupNumber._M_dataplus._M_p = (pointer)paVar2;
        sVar9 = strlen(__haystack);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,__haystack,__haystack + sVar9);
        local_130.fileName._M_dataplus._M_p = (pointer)paVar3;
        sVar9 = strlen(__haystack);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,__haystack,__haystack + sVar9);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
                   &local_130.fileName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130.fileName._M_dataplus._M_p != paVar3) {
          operator_delete(local_130.fileName._M_dataplus._M_p,
                          local_130.fileName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278.groupNumber._M_dataplus._M_p != paVar2) {
          operator_delete(local_278.groupNumber._M_dataplus._M_p,
                          local_278.groupNumber.field_2._M_allocated_capacity + 1);
        }
      }
    }
    closedir(__dirp);
  }
  pbVar5 = local_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar13 = local_2a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = (long)local_2a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar12 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar13,pbVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Processing .csv files ...",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_158 = &local_280->_M_rehash_policy;
    pbVar13 = local_2a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,",","");
      DataFrame::DataFrame(&local_130,&local_1d8,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_278.groupNumber,&local_a0,pbVar13);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_278.groupNumber._M_dataplus._M_p,
                           local_278.groupNumber._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278.groupNumber._M_dataplus._M_p != &local_278.groupNumber.field_2) {
        operator_delete(local_278.groupNumber._M_dataplus._M_p,
                        local_278.groupNumber.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_150,&local_a0,pbVar13);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,";","");
      DataFrame::read_csv(&local_130,&local_150,&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)local_c0,(ulong)pbVar13);
      local_160 = pbVar13;
      transpose(&local_130.data);
      if (local_130.header.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_130.header.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar14 = 0;
        lVar12 = 0;
        uVar10 = 0;
        do {
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          lVar4 = *(long *)((long)&((local_130.header.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar12);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a0,lVar4,
                     *(long *)((long)&(local_130.header.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + lVar12) + lVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_80,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&((local_130.data.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar14));
          local_68._M_buckets = (__buckets_ptr)0x0;
          local_68._M_bucket_count = local_280->_M_bucket_count;
          local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_68._M_element_count = local_280->_M_element_count;
          local_68._M_rehash_policy._M_max_load_factor = local_158->_M_max_load_factor;
          local_68._M_rehash_policy._4_4_ = *(undefined4 *)&local_158->field_0x4;
          local_68._M_rehash_policy._M_next_resize = local_158->_M_next_resize;
          local_68._M_single_bucket = (__node_base_ptr)0x0;
          local_1b8.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&local_68;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Professor>,std::allocator<std::pair<std::__cxx11::string_const,Professor>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Professor>,std::allocator<std::pair<std::__cxx11::string_const,Professor>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,Professor>,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Professor>,std::allocator<std::pair<std::__cxx11::string_const,Professor>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&local_68,local_280,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_true>_>_>
                      *)&local_1b8);
          Group::Group(&local_278,&local_1a0,&local_80,
                       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>_>
                        *)&local_68);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
                    ::operator[](local_288,
                                 (key_type *)
                                 ((long)&((local_130.header.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar12));
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_278);
          local_1b8.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (this_00->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_1b8.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
          _M_start = (this_00->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_1b8.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
          _M_finish = (this_00->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          (this_00->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_278.days.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
               super__Vector_impl_data._M_start;
          (this_00->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_278.days.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (this_00->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_278.days.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_278.days.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_278.days.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_278.days.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<Day,_std::allocator<Day>_>::~vector(&local_1b8);
          local_1b8.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)(this_00->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1b8.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(this_00->lesson_map).
                              super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                              super__Vector_impl_data._M_start;
          local_1b8.super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)(this_00->lesson_map).
                               super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                               super__Vector_impl_data._M_finish;
          (this_00->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_278.lesson_map.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
               super__Vector_impl_data._M_start;
          (this_00->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_278.lesson_map.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (this_00->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_278.lesson_map.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_278.lesson_map.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_278.lesson_map.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_278.lesson_map.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<Lesson,_std::allocator<Lesson>_>::~vector
                    ((vector<Lesson,_std::allocator<Lesson>_> *)&local_1b8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&(this_00->lesson_set)._M_t);
          if (local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0) {
            (this_00->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
            (this_00->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (this_00->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (this_00->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent
                 = &(this_00->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header;
            (this_00->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header;
            local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_278.lesson_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_278.lesson_set._M_t);
          std::vector<Lesson,_std::allocator<Lesson>_>::~vector(&local_278.lesson_map);
          std::vector<Day,_std::allocator<Day>_>::~vector(&local_278.days);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278.groupNumber._M_dataplus._M_p != &local_278.groupNumber.field_2) {
            operator_delete(local_278.groupNumber._M_dataplus._M_p,
                            local_278.groupNumber.field_2._M_allocated_capacity + 1);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          uVar10 = uVar10 + 1;
          lVar12 = lVar12 + 0x20;
          lVar14 = lVar14 + 0x18;
        } while (uVar10 < (ulong)((long)local_130.header.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_130.header.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_130.header);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_130.data);
      pbVar6 = local_160;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.delimeter._M_dataplus._M_p != &local_130.delimeter.field_2) {
        operator_delete(local_130.delimeter._M_dataplus._M_p,
                        local_130.delimeter.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.fileName._M_dataplus._M_p != &local_130.fileName.field_2) {
        operator_delete(local_130.fileName._M_dataplus._M_p,
                        local_130.fileName.field_2._M_allocated_capacity + 1);
      }
      pbVar13 = pbVar6 + 1;
    } while (pbVar13 !=
             local_2a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Files loaded.",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a8);
  return;
}

Assistant:

Grade( const std::string path_to_dir, const std::string path_to_rawdata, std::unordered_map <std::string, Professor> preps_map) {

        DIR *dir;
        struct dirent *ent;
        std::vector<std::string> file_names;

        const char* mask = ".csv";
        const std::string path = path_to_dir + path_to_rawdata;


        if ((dir = opendir(path.c_str())) != NULL) {
            /* print all the files and directories within directory */
            while ((ent = readdir (dir)) != NULL) {
                if(strstr(ent->d_name, mask) != NULL) {
                   //printf ("%s\n", ent->d_name);
                    std::string str(ent->d_name);
                    file_names.push_back(ent->d_name);
                }
            }
            closedir (dir);
        } else {
            /* could not open directory */
            perror ("");
        }
        sort(file_names.begin(), file_names.end());

        std::cout <<"Processing .csv files ..." << std::endl;

        for (std::vector<std::string>::const_iterator i = file_names.begin(); i != file_names.end(); ++i) {

            DataFrame df;

            std::cout << path + *i << std::endl;
            df.read_csv(path + *i, ";");

            std::string dep_number = (*i).substr(0, (*i).size()-4);
            //Department new_dep(dep_number, df, preps_map);

            transpose(df.data);
           // deptNumber = dep_number;
            for(size_t i = 0; i < df.header.size(); i++){
                //std::cout << df.header[i] << ":\n";
                group_map[df.header[i]] = Group(df.header[i], df.data[i], preps_map);
            }

            //departments[dep_number] = new_dep;
        }
        std::cout <<"Files loaded." << std::endl;

    }